

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O3

int __thiscall
RhombicToricLattice::neighbour(RhombicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  cartesian4 cVar9;
  int iVar10;
  int iVar11;
  invalid_argument *this_00;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  cartesian4 cVar16;
  cartesian4 local_40;
  undefined1 auVar4 [12];
  
  if ((sign != -1) && (sign != 1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Sign must be either 1 or -1.");
LAB_00120a69:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar10 = std::__cxx11::string::compare((char *)direction);
  if (iVar10 != 0) {
    iVar10 = std::__cxx11::string::compare((char *)direction);
    if (iVar10 != 0) {
      iVar10 = std::__cxx11::string::compare((char *)direction);
      if (iVar10 != 0) {
        iVar10 = std::__cxx11::string::compare((char *)direction);
        if (iVar10 != 0) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
          goto LAB_00120a69;
        }
      }
    }
  }
  cVar16 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  auVar4 = cVar16._0_12_;
  iVar13 = cVar16.y;
  local_40 = cVar16;
  iVar11 = std::__cxx11::string::compare((char *)direction);
  iVar10 = sign >> 0x1f;
  if (cVar16.w == 1) {
    if (iVar11 == 0) {
      iVar11 = (this->super_Lattice).l;
      uVar1 = (long)(int)(cVar16.x + (uint)(0 < sign)) % (long)iVar11;
      iVar13 = (int)(iVar13 + (uint)(0 < sign)) % iVar11;
      local_40.y = iVar13;
      local_40.x = (int)uVar1;
      uVar2 = (long)(cVar16.z - iVar10) % (long)iVar11;
      auVar3._8_8_ = uVar2 & 0xffffffff;
      auVar3._0_8_ = uVar1 & 0xffffffff;
      auVar4 = auVar3._0_12_;
      local_40.z = (int)uVar2;
      local_40.w = 0;
    }
    iVar11 = std::__cxx11::string::compare((char *)direction);
    cVar16 = local_40;
    if (iVar11 == 0) {
      iVar11 = (this->super_Lattice).l;
      uVar1 = (long)(int)(auVar4._0_4_ + (uint)(0 < sign)) % (long)iVar11;
      iVar14 = (int)uVar1;
      local_40.x = iVar14;
      cVar9 = local_40;
      uVar2 = (long)(int)(auVar4._8_4_ + (uint)(0 < sign)) % (long)iVar11;
      auVar5._8_8_ = uVar2 & 0xffffffff;
      auVar5._0_8_ = uVar1 & 0xffffffff;
      auVar4 = auVar5._0_12_;
      local_40.w = cVar16.w;
      local_40._0_8_ = cVar9._0_8_;
      local_40.z = (int)uVar2;
      iVar13 = (iVar13 - iVar10) % iVar11;
      local_40.y = iVar13;
      local_40.w = 0;
    }
    iVar14 = auVar4._8_4_;
    iVar15 = auVar4._0_4_;
    iVar11 = std::__cxx11::string::compare((char *)direction);
    cVar16 = local_40;
    if (iVar11 == 0) {
      iVar11 = (this->super_Lattice).l;
      iVar13 = (int)(iVar13 + (uint)(0 < sign)) % iVar11;
      auVar8._4_4_ = local_40.z;
      auVar8._8_4_ = local_40.w;
      auVar8._0_4_ = iVar13;
      local_40._0_8_ = auVar8._0_8_ << 0x20;
      iVar14 = (int)(iVar14 + (uint)(0 < sign)) % iVar11;
      local_40.w = cVar16.w;
      local_40.z = iVar14;
      iVar15 = (iVar15 - iVar10) % iVar11;
      local_40.x = iVar15;
      local_40.w = 0;
    }
    iVar10 = std::__cxx11::string::compare((char *)direction);
    if (iVar10 != 0) goto LAB_00120a13;
    uVar12 = (uint)(0 < sign);
    local_40.z = (this->super_Lattice).l;
    local_40.y = (int)(iVar13 + uVar12) % local_40.z;
    local_40.x = (int)(iVar15 + uVar12) % local_40.z;
    local_40.z = (int)(iVar14 + uVar12) % local_40.z;
    local_40.w = 0;
  }
  else {
    if (iVar11 == 0) {
      iVar11 = (this->super_Lattice).l;
      uVar1 = (long)(cVar16.x + iVar10 + iVar11) % (long)iVar11;
      iVar13 = (iVar10 + iVar13 + iVar11) % iVar11;
      local_40.y = iVar13;
      local_40.x = (int)uVar1;
      uVar2 = (long)(int)((iVar11 - (uint)(0 < sign)) + cVar16.z) % (long)iVar11;
      auVar6._8_8_ = uVar2 & 0xffffffff;
      auVar6._0_8_ = uVar1 & 0xffffffff;
      auVar4 = auVar6._0_12_;
      local_40.z = (int)uVar2;
      local_40.w = 1;
    }
    iVar11 = std::__cxx11::string::compare((char *)direction);
    cVar16 = local_40;
    if (iVar11 == 0) {
      iVar11 = (this->super_Lattice).l;
      uVar1 = (long)(auVar4._0_4_ + iVar10 + iVar11) % (long)iVar11;
      iVar14 = (int)uVar1;
      local_40.x = iVar14;
      cVar9 = local_40;
      uVar2 = (long)(iVar10 + auVar4._8_4_ + iVar11) % (long)iVar11;
      auVar7._8_8_ = uVar2 & 0xffffffff;
      auVar7._0_8_ = uVar1 & 0xffffffff;
      auVar4 = auVar7._0_12_;
      local_40.w = cVar16.w;
      local_40._0_8_ = cVar9._0_8_;
      local_40.z = (int)uVar2;
      iVar13 = (int)((iVar11 - (uint)(0 < sign)) + iVar13) % iVar11;
      local_40.y = iVar13;
      local_40.w = 1;
    }
    iVar14 = auVar4._8_4_;
    iVar15 = auVar4._0_4_;
    iVar11 = std::__cxx11::string::compare((char *)direction);
    cVar16 = local_40;
    if (iVar11 == 0) {
      iVar11 = (this->super_Lattice).l;
      iVar13 = (iVar13 + iVar10 + iVar11) % iVar11;
      auVar4._4_4_ = local_40.z;
      auVar4._8_4_ = local_40.w;
      auVar4._0_4_ = iVar13;
      local_40._0_8_ = auVar4._0_8_ << 0x20;
      iVar14 = (iVar10 + iVar14 + iVar11) % iVar11;
      local_40.w = cVar16.w;
      local_40.z = iVar14;
      iVar15 = (int)((iVar11 - (uint)(0 < sign)) + iVar15) % iVar11;
      local_40.x = iVar15;
      local_40.w = 1;
    }
    iVar11 = std::__cxx11::string::compare((char *)direction);
    if (iVar11 != 0) goto LAB_00120a13;
    local_40.z = (this->super_Lattice).l;
    local_40.y = (iVar13 + iVar10 + local_40.z) % local_40.z;
    local_40.x = (iVar15 + iVar10 + local_40.z) % local_40.z;
    local_40.z = (iVar10 + local_40.z + iVar14) % local_40.z;
    local_40.w = 1;
  }
LAB_00120a13:
  iVar10 = Lattice::coordinateToIndex(&this->super_Lattice,&local_40);
  return iVar10;
}

Assistant:

int RhombicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    // if (direction == "x")
    //     coordinate.x = (coordinate.x + sign + l) % l;
    // if (direction == "y")
    //     coordinate.y = (coordinate.y + sign + l) % l;
    // if (direction == "z")
    //     coordinate.z = (coordinate.z + sign + l) % l;
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.x = (coordinate.x + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.x = (coordinate.x - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.w = 1;
        }
    }
    return coordinateToIndex(coordinate);
}